

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O1

void rainbowCycle(int SpeedDelay)

{
  undefined8 in_RAX;
  int ledIndex;
  short sVar1;
  ushort uVar2;
  undefined8 uStack_38;
  
  sVar1 = 0;
  uStack_38 = in_RAX;
  do {
    uVar2 = 0;
    ledIndex = 0;
    do {
      Wheel((char)(uVar2 / 0x18) + (char)sVar1);
      uStack_38 = CONCAT17(Wheel::c[2],CONCAT25(Wheel::c._0_2_,(undefined5)uStack_38));
      WS2812B::Led::setColor(&leds,(RGB *)((long)&uStack_38 + 5),ledIndex);
      ledIndex = ledIndex + 1;
      uVar2 = uVar2 + 0x100;
    } while (ledIndex != 0x18);
    WS2812B::Led::show(&leds);
    usleep(SpeedDelay * 1000);
    sVar1 = sVar1 + 1;
  } while (sVar1 != 0x500);
  return;
}

Assistant:

void rainbowCycle(int SpeedDelay) {
    byte *c;
    uint16_t i, j;

    for(j=0; j<256*5; j++) { // 5 cycles of all colors on wheel
        for(i=0; i< NUM_LEDS; i++) {
            c=Wheel(((i * 256 / NUM_LEDS) + j) & 255);
            setPixel(i, *c, *(c+1), *(c+2));
        }
        showStrip();
        delay(SpeedDelay);
    }
}